

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::PreAttribute(cmXMLWriter *this)

{
  if (this->ElementOpen == false) {
    __assert_fail("this->ElementOpen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmXMLWriter.cxx"
                  ,0x7c,"void cmXMLWriter::PreAttribute()");
  }
  ConditionalLineBreak(this,this->BreakAttrib);
  if (this->BreakAttrib != false) {
    return;
  }
  std::operator<<(this->Output,' ');
  return;
}

Assistant:

void cmXMLWriter::PreAttribute()
{
  assert(this->ElementOpen);
  this->ConditionalLineBreak(this->BreakAttrib);
  if (!this->BreakAttrib) {
    this->Output << ' ';
  }
}